

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O0

void gimage::extractContour(Polygon *p,ImageU8 *mask,ImageU8 *image,long sx,long sy,int dir)

{
  bool bVar1;
  Polygon *in_RCX;
  long in_RDX;
  ImageU8 *in_RSI;
  ImageU8 *in_RDI;
  long in_R8;
  undefined4 in_R9D;
  int *unaff_retaddr;
  long y;
  long x;
  undefined4 in_stack_ffffffffffffffd0;
  
  Polygon::clear((Polygon *)0x188980);
  Polygon::add(in_RCX,in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffd0));
  while( true ) {
    bVar1 = anon_unknown_0::nextContourPixel
                      ((long *)x,(long *)y,unaff_retaddr,in_RDI,in_RSI,in_RDX,sy);
    if (!bVar1) break;
    Polygon::add(in_RCX,in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void extractContour(Polygon &p, ImageU8 &mask, const ImageU8 &image, long sx, long sy, int dir)
{
  long x=sx;
  long y=sy;

  p.clear();
  p.add(x, y);

  while (nextContourPixel(x, y, dir, mask, image, sx, sy))
  {
    p.add(x, y);
  }
}